

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

void start_server(uv_loop_t *loop,uv_tcp_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_server);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&addr,0);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_listen((uv_stream_t *)&tcp_server,0x80,connection_cb);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar3 = "r";
        uVar2 = 0xb6;
      }
      else {
        pcVar3 = "r";
        uVar2 = 0xb3;
      }
    }
    else {
      pcVar3 = "r";
      uVar2 = 0xb0;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0xad;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT_OK(r);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT_OK(r);
}